

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O3

matrix3 * matrix3_multiply(matrix3 *self,matrix3 *mT)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  uVar13 = *(undefined8 *)((long)&self->field_0 + 4);
  uVar14 = *(undefined8 *)((long)&self->field_0 + 0x10);
  uVar15 = *(undefined8 *)((long)&self->field_0 + 0x1c);
  fVar1 = (mT->field_0).m[6];
  fVar2 = (mT->field_0).m[7];
  fVar3 = (mT->field_0).m[8];
  fVar4 = (self->field_0).m[3];
  fVar20 = (float)uVar14;
  fVar21 = (float)((ulong)uVar14 >> 0x20);
  fVar5 = (self->field_0).m[0];
  fVar18 = (float)uVar13;
  fVar19 = (float)((ulong)uVar13 >> 0x20);
  fVar6 = (self->field_0).m[6];
  fVar16 = (float)uVar15;
  fVar17 = (float)((ulong)uVar15 >> 0x20);
  fVar7 = (mT->field_0).m[4];
  fVar8 = (mT->field_0).m[0];
  fVar9 = (mT->field_0).m[1];
  fVar10 = (mT->field_0).m[2];
  fVar11 = (mT->field_0).m[3];
  fVar12 = (mT->field_0).m[5];
  (self->field_0).m[0] = fVar10 * fVar6 + fVar8 * fVar5 + fVar9 * fVar4;
  (self->field_0).m[1] = fVar10 * fVar16 + fVar8 * fVar18 + fVar9 * fVar20;
  (self->field_0).m[2] = fVar10 * fVar17 + fVar8 * fVar19 + fVar9 * fVar21;
  (self->field_0).m[3] = fVar12 * fVar6 + fVar11 * fVar5 + fVar7 * fVar4;
  (self->field_0).m[4] = fVar12 * fVar16 + fVar11 * fVar18 + fVar7 * fVar20;
  (self->field_0).m[5] = fVar12 * fVar17 + fVar11 * fVar19 + fVar7 * fVar21;
  (self->field_0).m[6] = fVar3 * fVar6 + fVar1 * fVar5 + fVar2 * fVar4;
  (self->field_0).m[7] = fVar3 * fVar16 + fVar1 * fVar18 + fVar2 * fVar20;
  (self->field_0).m[8] = fVar17 * fVar3 + fVar19 * fVar1 + fVar21 * fVar2;
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_multiply(struct matrix3 *self, const struct matrix3 *mT)
{
	/* mT is the multiplicand */

	struct matrix3 r;

	matrix3_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10 + self->c02 * mT->c20;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10 + self->c12 * mT->c20;
	r.r02 = self->c20 * mT->c00 + self->c21 * mT->c10 + self->c22 * mT->c20;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11 + self->c02 * mT->c21;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11 + self->c12 * mT->c21;
	r.r12 = self->c20 * mT->c01 + self->c21 * mT->c11 + self->c22 * mT->c21;

	/* third row */
	r.r20 = self->c00 * mT->c02 + self->c01 * mT->c12 + self->c02 * mT->c22;
	r.r21 = self->c10 * mT->c02 + self->c11 * mT->c12 + self->c12 * mT->c22;
	r.r22 = self->c20 * mT->c02 + self->c21 * mT->c12 + self->c22 * mT->c22;

	matrix3_set(self, &r); /* overwrite/save it */

	return self;
}